

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void __thiscall QFormLayoutPrivate::updateSizes(QFormLayoutPrivate *this)

{
  QLayout *this_00;
  QFormLayoutItem *item;
  QFormLayoutItem *item_00;
  byte bVar1;
  bool bVar2;
  RowWrapPolicy RVar3;
  uint userVSpacing;
  uint uVar4;
  FieldGrowthPolicy FVar5;
  uint uVar6;
  QFlagsStorage<QSizePolicy::ControlType> controls2;
  QFlagsStorage<QSizePolicy::ControlType> controls2_00;
  QFlagsStorage<QSizePolicy::ControlType> QVar7;
  QFlagsStorage<QSizePolicy::ControlType> QVar8;
  int iVar9;
  int iVar10;
  QWidget *this_01;
  QStyle *this_02;
  pointer ppQVar11;
  QFormLayoutItem **ppQVar12;
  byte bVar13;
  QFormLayoutItem *pQVar14;
  int iVar15;
  QFormLayoutItem *pQVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int local_a0;
  int local_9c;
  int local_98;
  int local_80;
  int local_7c;
  int local_78;
  
  uVar4 = *(uint *)&this->field_0xb0;
  if ((uVar4 & 0x300000) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    RVar3 = QFormLayout::rowWrapPolicy((QFormLayout *)this_00);
    uVar17 = (ulong)(this->m_matrix).m_storage.d.size >> 1;
    this->field_0xb2 = this->field_0xb2 & 0xfc;
    this_01 = QLayout::parentWidget(this_00);
    uVar4 = 0;
    if (this_01 == (QWidget *)0x0) {
      this_02 = (QStyle *)0x0;
    }
    else {
      this_02 = QWidget::style(this_01);
    }
    userVSpacing = QFormLayout::verticalSpacing((QFormLayout *)this_00);
    if (RVar3 != WrapAllRows) {
      uVar4 = QFormLayout::horizontalSpacing((QFormLayout *)this_00);
    }
    iVar15 = 0;
    uVar18 = uVar17 & 0xffffffff;
    if ((int)uVar17 < 1) {
      uVar18 = 0;
    }
    local_80 = 0;
    local_a0 = 0;
    local_7c = 0;
    local_9c = 0;
    local_78 = 0;
    local_98 = 0;
    pQVar14 = (QFormLayoutItem *)0x0;
    pQVar16 = (QFormLayoutItem *)0x0;
    bVar13 = 0;
    bVar1 = 0;
    for (lVar19 = 0; uVar18 << 4 != lVar19; lVar19 = lVar19 + 0x10) {
      ppQVar11 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      item = *(QFormLayoutItem **)((long)ppQVar11 + lVar19);
      ppQVar12 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                           (&this->m_matrix,iVar15,1);
      item_00 = *ppQVar12;
      if (item != (QFormLayoutItem *)0x0 || item_00 != (QFormLayoutItem *)0x0) {
        if (item != (QFormLayoutItem *)0x0) {
          FVar5 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
          updateFormLayoutItem(item,userVSpacing,FVar5,false);
          if (item->isHfw == true) {
            *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
          }
          uVar6 = (*item->item->_vptr_QLayoutItem[5])();
          if ((uVar6 & 2) != 0) {
            bVar13 = 1;
          }
          if ((uVar6 & 1) != 0) {
            bVar1 = 1;
          }
        }
        if (item_00 != (QFormLayoutItem *)0x0) {
          FVar5 = QFormLayout::fieldGrowthPolicy((QFormLayout *)this_00);
          if (item == (QFormLayoutItem *)0x0) {
            updateFormLayoutItem(item_00,userVSpacing,FVar5,item_00->fullRow);
            uVar6 = 0;
            if (item_00->fullRow == false) goto LAB_0037a650;
          }
          else {
            updateFormLayoutItem(item_00,userVSpacing,FVar5,false);
LAB_0037a650:
            uVar6 = uVar4;
          }
          item_00->sbsHSpace = uVar6;
          if (item_00->isHfw == true) {
            *(uint *)&this->field_0xb0 = *(uint *)&this->field_0xb0 & 0xfffcffff | 0x10000;
          }
          uVar6 = (*item_00->item->_vptr_QLayoutItem[5])();
          if ((uVar6 & 2) != 0) {
            bVar13 = 1;
          }
          if ((uVar6 & 1) != 0) {
            bVar1 = 1;
          }
        }
        if (this_02 == (QStyle *)0x0 || -1 < (int)(uVar4 | userVSpacing)) {
LAB_0037a936:
          if (item != (QFormLayoutItem *)0x0) {
LAB_0037a93b:
            iVar10 = (item->minSize).wd.m_i;
            if (local_98 <= iVar10) {
              local_98 = iVar10;
            }
            iVar10 = (item->sizeHint).wd.m_i;
            if (local_78 <= iVar10) {
              local_78 = iVar10;
            }
          }
          if (item_00 == (QFormLayoutItem *)0x0) {
            pQVar14 = (QFormLayoutItem *)0x0;
            pQVar16 = item;
            goto LAB_0037a9b0;
          }
        }
        else {
          controls2.i = 1;
          if (item != (QFormLayoutItem *)0x0) {
            controls2.i = (*item->item->_vptr_QLayoutItem[0x10])();
          }
          controls2_00.i = 1;
          if (item_00 != (QFormLayoutItem *)0x0) {
            controls2_00.i = (*item_00->item->_vptr_QLayoutItem[0x10])();
          }
          if (-1 < (int)userVSpacing) {
LAB_0037a6e5:
            if (-1 < (int)uVar4 || RVar3 == WrapAllRows) goto LAB_0037a936;
            if (item == (QFormLayoutItem *)0x0) {
LAB_0037a907:
              if ((~item_00->fullRow & item_00 != (QFormLayoutItem *)0x0) == 0) goto LAB_0037a962;
LAB_0037a916:
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)0x40,(ControlTypes)0x100,Horizontal,
                                  (QStyleOption *)0x0,this_01);
              item_00->sbsHSpace = iVar10;
              goto LAB_0037a936;
            }
            if (item_00 != (QFormLayoutItem *)0x0) goto LAB_0037a916;
            goto LAB_0037a93b;
          }
          if (RVar3 == WrapAllRows) {
            if (pQVar14 != (QFormLayoutItem *)0x0) {
              pQVar16 = pQVar14;
            }
            pQVar14 = pQVar16;
            if (item != (QFormLayoutItem *)0x0) {
              pQVar14 = item;
            }
            QVar7.i = 1;
            if (pQVar16 != (QFormLayoutItem *)0x0) {
              QVar7.i = (*pQVar16->item->_vptr_QLayoutItem[0x10])();
            }
            QVar8.i = 1;
            if (pQVar14 != (QFormLayoutItem *)0x0) {
              QVar8.i = (*pQVar14->item->_vptr_QLayoutItem[0x10])();
            }
            if (item != (QFormLayoutItem *)0x0 && pQVar16 != (QFormLayoutItem *)0x0) {
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)QVar7.i,(ControlTypes)controls2.i,Vertical,
                                  (QStyleOption *)0x0,this_01);
              item->vSpace = iVar10;
            }
            if ((item_00 != (QFormLayoutItem *)0x0) && (pQVar14 != (QFormLayoutItem *)0x0)) {
              iVar10 = QStyle::combinedLayoutSpacing
                                 (this_02,(ControlTypes)QVar8.i,(ControlTypes)controls2_00.i,
                                  Vertical,(QStyleOption *)0x0,this_01);
              item_00->vSpace = iVar10;
            }
            goto LAB_0037a936;
          }
          if (pQVar16 == (QFormLayoutItem *)0x0) {
            pQVar16 = pQVar14;
          }
          QVar7.i = 1;
          if (pQVar16 != (QFormLayoutItem *)0x0) {
            QVar7.i = (*pQVar16->item->_vptr_QLayoutItem[0x10])();
          }
          QVar8.i = 1;
          if (pQVar14 != (QFormLayoutItem *)0x0) {
            QVar8.i = (*pQVar14->item->_vptr_QLayoutItem[0x10])();
          }
          if ((item != (QFormLayoutItem *)0x0) && (bVar2 = QFormLayoutItem::isHidden(item), !bVar2))
          {
            iVar10 = QStyle::combinedLayoutSpacing
                               (this_02,(ControlTypes)QVar7.i,(ControlTypes)controls2.i,Vertical,
                                (QStyleOption *)0x0,this_01);
            if (item_00 != (QFormLayoutItem *)0x0) {
              item->vSpace = iVar10;
              goto LAB_0037a84f;
            }
            iVar9 = QStyle::combinedLayoutSpacing
                              (this_02,(ControlTypes)QVar8.i,(ControlTypes)controls2.i,Vertical,
                               (QStyleOption *)0x0,this_01);
            pQVar14 = item;
            if (iVar9 < iVar10) {
              iVar9 = iVar10;
            }
LAB_0037a8ab:
            pQVar14->vSpace = iVar9;
            goto LAB_0037a6e5;
          }
          if (item_00 == (QFormLayoutItem *)0x0) goto LAB_0037a6e5;
LAB_0037a84f:
          bVar2 = QFormLayoutItem::isHidden(item_00);
          if (bVar2) goto LAB_0037a6e5;
          if (item != (QFormLayoutItem *)0x0) {
            iVar9 = QStyle::combinedLayoutSpacing
                              (this_02,(ControlTypes)QVar8.i,(ControlTypes)controls2_00.i,Vertical,
                               (QStyleOption *)0x0,this_01);
            pQVar14 = item_00;
            goto LAB_0037a8ab;
          }
          iVar9 = QStyle::combinedLayoutSpacing
                            (this_02,(ControlTypes)QVar7.i,(ControlTypes)controls2_00.i,Vertical,
                             (QStyleOption *)0x0,this_01);
          iVar10 = QStyle::combinedLayoutSpacing
                             (this_02,(ControlTypes)QVar8.i,(ControlTypes)controls2_00.i,Vertical,
                              (QStyleOption *)0x0,this_01);
          if (iVar10 < iVar9) {
            iVar10 = iVar9;
          }
          item_00->vSpace = iVar10;
          if (-1 >= (int)uVar4 && RVar3 != WrapAllRows) goto LAB_0037a907;
        }
LAB_0037a962:
        iVar10 = (item_00->minSize).wd.m_i;
        pQVar14 = item_00;
        if (item_00->fullRow == true) {
          if (local_a0 <= iVar10) {
            local_a0 = iVar10;
          }
          iVar10 = (item_00->sizeHint).wd.m_i;
          pQVar16 = item;
          if (local_80 <= iVar10) {
            local_80 = iVar10;
          }
        }
        else {
          iVar10 = iVar10 + item_00->sbsHSpace;
          if (local_9c <= iVar10) {
            local_9c = iVar10;
          }
          iVar10 = item_00->sbsHSpace + (item_00->sizeHint).wd.m_i;
          pQVar16 = item;
          if (local_7c <= iVar10) {
            local_7c = iVar10;
          }
        }
      }
LAB_0037a9b0:
      iVar15 = iVar15 + 1;
    }
    if (RVar3 == WrapAllRows) {
      if (local_7c < local_80) {
        local_7c = local_80;
      }
      if (local_7c < local_78) {
        local_7c = local_78;
      }
      this->sh_width = local_7c;
      if (local_9c < local_a0) {
        local_9c = local_a0;
      }
      if (local_9c < local_98) {
        local_9c = local_98;
      }
      this->min_width = local_9c;
      local_78 = 0;
    }
    else {
      iVar15 = local_7c + local_78;
      if (local_7c + local_78 <= local_80) {
        iVar15 = local_80;
      }
      this->sh_width = iVar15;
      if (RVar3 == DontWrapRows) {
        iVar15 = local_9c + local_98;
        if (local_9c + local_98 <= local_a0) {
          iVar15 = local_a0;
        }
        this->min_width = iVar15;
        local_78 = 0xffffff;
      }
      else {
        if (local_a0 <= local_9c) {
          local_a0 = local_9c;
        }
        if (local_a0 < local_98) {
          local_a0 = local_98;
        }
        this->min_width = local_a0;
        local_78 = local_78 + local_9c;
      }
    }
    this->thresh_width = local_78;
    uVar4 = (uint)bVar1 << 0x17 | *(uint *)&this->field_0xb0 & 0xff3fffff | (uint)bVar13 << 0x16;
  }
  *(uint *)&this->field_0xb0 = uVar4 & 0xffcfffff;
  return;
}

Assistant:

void QFormLayoutPrivate::updateSizes()
{
    Q_Q(QFormLayout);

    if (sizesDirty) {
        QFormLayout::RowWrapPolicy wrapPolicy = q->rowWrapPolicy();
        bool wrapAllRows = (wrapPolicy == QFormLayout::WrapAllRows);
        bool dontWrapRows = (wrapPolicy == QFormLayout::DontWrapRows);
        int rr = m_matrix.rowCount();

        has_hfw = false;

        // If any control can expand, so can this layout
        // Wrapping doesn't affect expansion, though, just the minsize
        bool expandH = false;
        bool expandV = false;

        QFormLayoutItem *prevLbl = nullptr;
        QFormLayoutItem *prevFld = nullptr;

        QWidget *parent = q->parentWidget();
        QStyle *style = parent ? parent->style() : nullptr;

        int userVSpacing = q->verticalSpacing();
        int userHSpacing = wrapAllRows ? 0 : q->horizontalSpacing();

        int maxMinLblWidth = 0;
        int maxMinFldWidth = 0; // field with label
        int maxMinIfldWidth = 0; // independent field

        int maxShLblWidth = 0;
        int maxShFldWidth = 0;
        int maxShIfldWidth = 0;

        for (int i = 0; i < rr; ++i) {
            QFormLayoutItem *label = m_matrix(i, 0);
            QFormLayoutItem *field = m_matrix(i, 1);

            // Skip empty rows
            if (!label && !field)
                continue;

            if (label) {
                updateFormLayoutItem(label, userVSpacing, q->fieldGrowthPolicy(), false);
                if (label->isHfw)
                    has_hfw = true;
                Qt::Orientations o = label->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }
            if (field) {
                updateFormLayoutItem(field, userVSpacing, q->fieldGrowthPolicy(), !label && field->fullRow);
                field->sbsHSpace = (!label && field->fullRow) ? 0 : userHSpacing;
                if (field->isHfw)
                    has_hfw = true;

                Qt::Orientations o = field->expandingDirections();

                if (o & Qt::Vertical)
                    expandV = true;
                if (o & Qt::Horizontal)
                    expandH = true;
            }

            // See if we need to calculate default spacings
            if ((userHSpacing < 0 || userVSpacing < 0) && style) {
                QSizePolicy::ControlTypes lbltypes =
                    QSizePolicy::ControlTypes(label ? label->controlTypes() : QSizePolicy::DefaultType);
                QSizePolicy::ControlTypes fldtypes =
                    QSizePolicy::ControlTypes(field ? field->controlTypes() : QSizePolicy::DefaultType);

                // VSpacing
                if (userVSpacing < 0) {
                    if (wrapAllRows) {
                        // label spacing is to a previous item
                        QFormLayoutItem *lbltop = prevFld ? prevFld : prevLbl;
                        // field spacing is to the label (or a previous item)
                        QFormLayoutItem *fldtop = label ? label : lbltop;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);
                        if (label && lbltop)
                            label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                        if (field && fldtop)
                            field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                    } else {
                        // Side by side..  we have to also consider the spacings to empty cells, which can strangely be more than
                        // non empty cells..
                        QFormLayoutItem *lbltop = prevLbl ? prevLbl : prevFld;
                        QFormLayoutItem *fldtop = prevFld;
                        QSizePolicy::ControlTypes lbltoptypes =
                            QSizePolicy::ControlTypes(lbltop ? lbltop->controlTypes() : QSizePolicy::DefaultType);
                        QSizePolicy::ControlTypes fldtoptypes =
                            QSizePolicy::ControlTypes(fldtop ? fldtop->controlTypes() : QSizePolicy::DefaultType);

                        // To be compatible to QGridLayout, we have to compare solitary labels & fields with both predecessors
                        if (label && !label->isHidden()) {
                            if (!field) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                                label->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                label->vSpace = style->combinedLayoutSpacing(lbltoptypes, lbltypes, Qt::Vertical, nullptr, parent);
                            }
                        }

                        if (field && !field->isHidden()) {
                            // check spacing against both the previous label and field
                            if (!label) {
                                int lblspacing = style->combinedLayoutSpacing(lbltoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                int fldspacing = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                                field->vSpace = qMax(lblspacing, fldspacing);
                            } else {
                                field->vSpace = style->combinedLayoutSpacing(fldtoptypes, fldtypes, Qt::Vertical, nullptr, parent);
                            }
                        }
                    }
                }

                // HSpacing
                // hard-coded the left and right control types so that all the rows have the same
                // inter-column spacing (otherwise the right column isn't always left aligned)
                if (userHSpacing < 0 && !wrapAllRows && (label || !field->fullRow) && field)
                    field->sbsHSpace = style->combinedLayoutSpacing(QSizePolicy::Label, QSizePolicy::LineEdit, Qt::Horizontal, nullptr, parent);
            }

            // Now update our min/sizehint widths
            // We choose to put the spacing in the field side in sbs, so
            // the right edge of the labels will align, but fields may
            // be a little ragged.. since different controls may have
            // different appearances, a slight raggedness in the left
            // edges of fields can be tolerated.
            // (Note - field->sbsHSpace is 0 for WrapAllRows mode)
            if (label) {
                maxMinLblWidth = qMax(maxMinLblWidth, label->minSize.width());
                maxShLblWidth = qMax(maxShLblWidth, label->sizeHint.width());
            }
            if (field) {
                if (field->fullRow) {
                    maxMinIfldWidth = qMax(maxMinIfldWidth, field->minSize.width());
                    maxShIfldWidth = qMax(maxShIfldWidth, field->sizeHint.width());
                } else {
                    maxMinFldWidth = qMax(maxMinFldWidth, field->minSize.width() + field->sbsHSpace);
                    maxShFldWidth = qMax(maxShFldWidth, field->sizeHint.width() + field->sbsHSpace);
                }
            }

            prevLbl = label;
            prevFld = field;
        }

        // Now, finally update the min/sizeHint widths
        if (wrapAllRows) {
            sh_width = qMax(maxShLblWidth, qMax(maxShIfldWidth, maxShFldWidth));
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // in two line, we don't care as much about the threshold width
            thresh_width = 0;
        } else if (dontWrapRows) {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            min_width = qMax(maxMinLblWidth + maxMinFldWidth, maxMinIfldWidth);
            thresh_width = QWIDGETSIZE_MAX;
        } else {
            // This is just the max widths glommed together
            sh_width = qMax(maxShLblWidth + maxShFldWidth, maxShIfldWidth);
            // min width needs to be the min when everything is wrapped,
            // otherwise we'll never get set with a width that causes wrapping
            min_width = qMax(maxMinLblWidth, qMax(maxMinIfldWidth, maxMinFldWidth));
            // We split a pair at label sh + field min (### for now..)
            thresh_width = maxShLblWidth + maxMinFldWidth;
        }

        // Update the expansions
        expandVertical = expandV;
        expandHorizontal = expandH;
    }
    sizesDirty = false;
}